

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

int mbedtls_aes_crypt_cfb8
              (mbedtls_aes_context *ctx,int mode,size_t length,uchar *iv,uchar *input,uchar *output)

{
  undefined4 uVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  byte unaff_R13B;
  size_t sVar5;
  undefined7 uStack_47;
  undefined1 local_40;
  
  if (length != 0) {
    sVar5 = 0;
    do {
      uStack_47 = (undefined7)((ulong)*(undefined8 *)iv >> 8);
      uVar1 = *(undefined4 *)(iv + 8);
      uVar2 = *(undefined8 *)(iv + 8);
      mbedtls_aes_crypt_ecb(ctx,1,iv,iv);
      bVar3 = unaff_R13B;
      if (mode == 0) {
        bVar3 = input[sVar5];
      }
      bVar4 = *iv ^ input[sVar5];
      unaff_R13B = bVar4;
      if (mode != 1) {
        unaff_R13B = bVar3;
      }
      output[sVar5] = bVar4;
      local_40 = (undefined1)uVar1;
      *(undefined8 *)(iv + 7) = uVar2;
      *(ulong *)iv = CONCAT17(local_40,uStack_47);
      iv[0xf] = unaff_R13B;
      sVar5 = sVar5 + 1;
    } while (length != sVar5);
  }
  return 0;
}

Assistant:

int mbedtls_aes_crypt_cfb8( mbedtls_aes_context *ctx,
                       int mode,
                       size_t length,
                       unsigned char iv[16],
                       const unsigned char *input,
                       unsigned char *output )
{
    unsigned char c;
    unsigned char ov[17];

    while( length-- )
    {
        memcpy( ov, iv, 16 );
        mbedtls_aes_crypt_ecb( ctx, MBEDTLS_AES_ENCRYPT, iv, iv );

        if( mode == MBEDTLS_AES_DECRYPT )
            ov[16] = *input;

        c = *output++ = (unsigned char)( iv[0] ^ *input++ );

        if( mode == MBEDTLS_AES_ENCRYPT )
            ov[16] = c;

        memcpy( iv, ov + 1, 16 );
    }

    return( 0 );
}